

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O3

bool __thiscall OpenMD::SelectionCompiler::clauseComparator(SelectionCompiler *this)

{
  any *this_00;
  char *pcVar1;
  bool bVar2;
  int iVar3;
  type_info *ptVar4;
  int *piVar5;
  float *pfVar6;
  any floatVal;
  Token tokenValue;
  Token tokenComparator;
  Token tokenAtomProperty;
  _Arg __arg;
  any local_98;
  Token local_80;
  Token local_68;
  float local_4c;
  value_type local_48;
  Token local_30;
  _Arg local_18;
  
  tokenNext(&local_30,this);
  tokenNext(&local_68,this);
  if ((local_68.tok & 0x2400U) == 0) {
    bVar2 = comparisonOperatorExpected(this);
    goto LAB_0025b5e5;
  }
  tokenNext(&local_80,this);
  if (local_80.tok - 4U < 0xfffffffe) {
    bVar2 = numberExpected(this);
  }
  else {
    this_00 = &local_80.value;
    ptVar4 = std::any::type(this_00);
    pcVar1 = *(char **)(ptVar4 + 8);
    if (pcVar1 == _put) {
LAB_0025b503:
      piVar5 = (int *)std::__any_caster<int>(this_00);
      if (piVar5 == (int *)0x0) goto LAB_0025b622;
      local_4c = (float)*piVar5;
    }
    else {
      if (*pcVar1 != '*') {
        iVar3 = strcmp(pcVar1,_put);
        if (iVar3 == 0) goto LAB_0025b503;
      }
      ptVar4 = std::any::type(this_00);
      pcVar1 = *(char **)(ptVar4 + 8);
      if (pcVar1 != _seekoff) {
        if (*pcVar1 != '*') {
          iVar3 = strcmp(pcVar1,_seekoff);
          if (iVar3 == 0) goto LAB_0025b51a;
        }
        bVar2 = false;
        goto LAB_0025b5cd;
      }
LAB_0025b51a:
      pfVar6 = (float *)std::__any_caster<float>(this_00);
      if (pfVar6 == (float *)0x0) {
LAB_0025b622:
        std::__throw_bad_any_cast();
      }
      local_4c = *pfVar6;
    }
    local_98._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
    local_98._M_storage._M_ptr = (void *)0x0;
    std::any::operator=(&local_98,&local_4c);
    local_48.tok = local_68.tok;
    local_48.intValue = local_30.tok;
    local_48.value._M_storage._M_ptr = (void *)0x0;
    if (local_98._M_manager == (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
      local_48.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
    }
    else {
      local_18._M_any = &local_48.value;
      (*local_98._M_manager)(_Op_clone,&local_98,&local_18);
    }
    std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::push_back
              (&this->ltokenPostfix,&local_48);
    if (local_48.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
      (*local_48.value._M_manager)(_Op_destroy,&local_48.value,(_Arg *)0x0);
    }
    if (local_98._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
      (*local_98._M_manager)(_Op_destroy,&local_98,(_Arg *)0x0);
    }
    bVar2 = true;
  }
LAB_0025b5cd:
  if (local_80.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_80.value._M_manager)(_Op_destroy,&local_80.value,(_Arg *)0x0);
  }
LAB_0025b5e5:
  if (local_68.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_68.value._M_manager)(_Op_destroy,&local_68.value,(_Arg *)0x0);
  }
  if (local_30.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_30.value._M_manager)(_Op_destroy,&local_30.value,(_Arg *)0x0);
  }
  return bVar2;
}

Assistant:

bool SelectionCompiler::clauseComparator() {
    Token tokenAtomProperty = tokenNext();
    Token tokenComparator   = tokenNext();
    if ((tokenComparator.tok & Token::comparator) == 0) {
      return comparisonOperatorExpected();
    }

    Token tokenValue = tokenNext();
    if (tokenValue.tok != Token::integer && tokenValue.tok != Token::decimal) {
      return numberExpected();
    }

    float val;
    if (tokenValue.value.type() == typeid(int)) {
      val = std::any_cast<int>(tokenValue.value);
    } else if (tokenValue.value.type() == typeid(float)) {
      val = std::any_cast<float>(tokenValue.value);
    } else {
      return false;
    }

    std::any floatVal;
    floatVal = val;
    return addTokenToPostfix(
        Token(tokenComparator.tok, tokenAtomProperty.tok, floatVal));
  }